

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginTabItem(char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImGuiTabBar *this;
  bool bVar1;
  uint in_EDX;
  ImGuiTabItem *tab;
  bool ret;
  ImGuiTabBar *tab_bar;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindow *in_stack_00000148;
  ImGuiTabItemFlags in_stack_00000154;
  bool *in_stack_00000158;
  char *in_stack_00000160;
  ImGuiTabBar *in_stack_00000168;
  undefined4 in_stack_ffffffffffffffc4;
  ImGuiID id;
  bool local_1;
  
  if ((GImGui->CurrentWindow->SkipItems & 1U) == 0) {
    this = GImGui->CurrentTabBar;
    if (this == (ImGuiTabBar *)0x0) {
      local_1 = false;
    }
    else {
      bVar1 = TabItemEx(in_stack_00000168,in_stack_00000160,in_stack_00000158,in_stack_00000154,
                        in_stack_00000148);
      id = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc4);
      if ((bVar1) && ((in_EDX & 8) == 0)) {
        ImVector<ImGuiTabItem>::operator[](&this->Tabs,(int)this->LastTabItemIdx);
        PushOverrideID(id);
      }
      local_1 = (bool)((byte)(id >> 0x18) & 1);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool    ImGui::BeginTabItem(const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT_USER_ERROR(tab_bar, "BeginTabItem() Needs to be called between BeginTabBar() and EndTabBar()!");
        return false;
    }
    bool ret = TabItemEx(tab_bar, label, p_open, flags, NULL);
    if (ret && !(flags & ImGuiTabItemFlags_NoPushId))
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
        PushOverrideID(tab->ID); // We already hashed 'label' so push into the ID stack directly instead of doing another hash through PushID(label)
    }
    return ret;
}